

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

MergeEngine * vdbeMergeEngineNew(int nReader)

{
  int iVar1;
  int iVar2;
  MergeEngine *__s;
  u64 n;
  
  iVar2 = 2;
  do {
    iVar1 = iVar2;
    iVar2 = iVar1 * 2;
  } while (iVar1 < nReader);
  if (sqlite3Config.xTestCallback != (_func_int_int *)0x0) {
    iVar2 = (*sqlite3Config.xTestCallback)(100);
    if (iVar2 != 0) {
      __s = (MergeEngine *)0x0;
      goto LAB_001569bc;
    }
  }
  n = (u64)(iVar1 * 0x54 + 0x20);
  __s = (MergeEngine *)sqlite3Malloc(n);
  if (__s != (MergeEngine *)0x0) {
    memset(__s,0,n);
  }
LAB_001569bc:
  if (__s != (MergeEngine *)0x0) {
    __s->nTree = iVar1;
    __s->pTask = (SortSubtask *)0x0;
    __s->aReadr = (PmaReader *)(__s + 1);
    __s->aTree = (int *)((long)__s + (long)iVar1 * 0x50 + 0x20);
  }
  return __s;
}

Assistant:

static MergeEngine *vdbeMergeEngineNew(int nReader){
  int N = 2;                      /* Smallest power of two >= nReader */
  int nByte;                      /* Total bytes of space to allocate */
  MergeEngine *pNew;              /* Pointer to allocated object to return */

  assert( nReader<=SORTER_MAX_MERGE_COUNT );

  while( N<nReader ) N += N;
  nByte = sizeof(MergeEngine) + N * (sizeof(int) + sizeof(PmaReader));

  pNew = sqlite3FaultSim(100) ? 0 : (MergeEngine*)sqlite3MallocZero(nByte);
  if( pNew ){
    pNew->nTree = N;
    pNew->pTask = 0;
    pNew->aReadr = (PmaReader*)&pNew[1];
    pNew->aTree = (int*)&pNew->aReadr[N];
  }
  return pNew;
}